

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O3

bool __thiscall QCompleter::eventFilter(QCompleter *this,QObject *o,QEvent *e)

{
  ushort uVar1;
  QCompleterPrivate *this_00;
  QAbstractItemView *this_01;
  QWidget *this_02;
  QModelIndex index;
  QModelIndex index_00;
  undefined1 uVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Data *pDVar8;
  long lVar9;
  QCompletionModel *pQVar10;
  QObject *pQVar11;
  QObject *pQVar12;
  long in_FS_OFFSET;
  undefined4 uVar13;
  undefined4 uVar14;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tVar15;
  undefined8 local_98;
  undefined8 uStack_90;
  QAbstractItemModel *pQStack_88;
  QArrayData *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QCompleterPrivate **)&this->field_0x8;
  pDVar8 = (this_00->widget).wp.d;
  if ((pDVar8 == (Data *)0x0) || (*(int *)(pDVar8 + 4) == 0)) {
    pQVar12 = (QObject *)0x0;
  }
  else {
    pQVar12 = (this_00->widget).wp.value;
  }
  if (pQVar12 == o) {
    if (*(short *)(e + 8) == 0x12) {
      if ((QWidget *)this_00->popup != (QWidget *)0x0) {
        QWidget::hide((QWidget *)this_00->popup);
      }
      goto LAB_0064c223;
    }
    if ((*(short *)(e + 8) != 9) || (this_00->eatFocusOut != true)) goto LAB_0064c223;
    this_00->hiddenBecauseNoMatch = false;
    if ((this_00->popup == (QAbstractItemView *)0x0) ||
       (pQVar12 = (QObject *)0x1,
       (((this_00->popup->super_QAbstractScrollArea).super_QFrame.super_QWidget.data)->
        widget_attributes & 0x8000) == 0)) goto LAB_0064c223;
    goto LAB_0064c3fa;
  }
LAB_0064c223:
  this_01 = (QAbstractItemView *)this_00->popup;
  if (this_01 != (QAbstractItemView *)o) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      uVar2 = QObject::eventFilter(&this->super_QObject,(QEvent *)o);
      return (bool)uVar2;
    }
    goto LAB_0064c831;
  }
  uVar1 = *(ushort *)(e + 8);
  pQVar12 = (QObject *)0x0;
  if (uVar1 < 6) {
    if (uVar1 == 2) {
      if ((*(byte *)(*(long *)(this_01 + 0x20) + 8) & 2) != 0) goto LAB_0064c3f7;
      cVar4 = QGuiApplicationPrivate::maybeForwardEventToVirtualKeyboard(e);
      pQVar12 = (QObject *)0x1;
      if (cVar4 == '\0') {
        QWidget::hide((QWidget *)this_00->popup);
      }
    }
    else if (uVar1 == 3) {
      QGuiApplicationPrivate::maybeForwardEventToVirtualKeyboard(e);
      pQVar12 = (QObject *)0x1;
    }
  }
  else if ((uVar1 == 0x53) || (uVar1 == 0x33)) {
    pDVar8 = (this_00->widget).wp.d;
    if ((pDVar8 == (Data *)0x0) ||
       ((*(int *)(pDVar8 + 4) == 0 ||
        (pQVar11 = (this_00->widget).wp.value, pQVar11 == (QObject *)0x0)))) {
LAB_0064c3f7:
      pQVar12 = (QObject *)0x0;
    }
    else {
      pQVar12 = (QObject *)0x0;
      if (*(int *)(pDVar8 + 4) == 0) {
        pQVar11 = pQVar12;
      }
      QCoreApplication::sendEvent(pQVar11,e);
    }
  }
  else {
    pQVar12 = (QObject *)0x0;
    if (uVar1 == 6) {
      local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QAbstractItemView::currentIndex((QModelIndex *)&local_58,this_01);
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      QAbstractItemView::selectionModel((QAbstractItemView *)this_00->popup);
      QItemSelectionModel::selectedIndexes();
      iVar5 = *(int *)(e + 0x40);
      uVar6 = iVar5 + 0xfefffff0;
      if (uVar6 < 8) {
        if ((3U >> (uVar6 & 0x1f) & 1) != 0) {
          uVar6 = QKeyEvent::modifiers();
          uVar6 = uVar6 >> 0x1a;
joined_r0x0064c4e6:
          if ((uVar6 & 1) == 0) goto LAB_0064c4ec;
LAB_0064c672:
          pQVar12 = (QObject *)0x0;
          goto LAB_0064c73e;
        }
        if ((0x28U >> (uVar6 & 0x1f) & 1) == 0) {
          uVar6 = 0xc0 >> (uVar6 & 0x1f);
          goto joined_r0x0064c4e6;
        }
        iVar7 = (int)local_58;
        if ((((local_68 != (undefined1 *)0x0) || ((int)local_58 < 0)) || ((long)local_58 < 0)) ||
           ((local_48.ptr == (QAbstractItemModel *)0x0 ||
            (this_00->mode != UnfilteredPopupCompletion)))) {
          if (iVar5 != 0x1000013) {
            if (iVar5 != 0x1000015) goto LAB_0064c4ec;
            if (((-1 < (int)local_58) && (-1 < (long)local_58)) &&
               (local_48.ptr != (QAbstractItemModel *)0x0)) {
              local_98 = (undefined1 *)0xffffffffffffffff;
              uStack_90 = (undefined1 *)0x0;
              pQStack_88 = (QAbstractItemModel *)0x0;
              iVar5 = (**(code **)(*(long *)this_00->proxy + 0x78))();
              if (iVar7 == iVar5 + -1) {
                cVar4 = this_00->wrap;
                goto joined_r0x0064c7f5;
              }
              goto LAB_0064c672;
            }
            pQVar10 = this_00->proxy;
            iVar5 = this_00->column;
            lVar9 = *(long *)pQVar10;
            iVar7 = 0;
LAB_0064c71a:
            pQStack_88 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
            uStack_90 = &DAT_aaaaaaaaaaaaaaaa;
            local_98 = &DAT_aaaaaaaaaaaaaaaa;
            (**(code **)(lVar9 + 0x60))(&local_98,pQVar10,iVar7,iVar5);
            iVar5 = (int)local_98;
            iVar7 = local_98._4_4_;
            uVar13 = (undefined4)uStack_90;
            uVar14 = uStack_90._4_4_;
            tVar15.ptr = pQStack_88;
            goto LAB_0064c72a;
          }
          if ((((int)local_58 < 0) || ((long)local_58 < 0)) ||
             (local_48.ptr == (QAbstractItemModel *)0x0)) {
            local_98 = (undefined1 *)0xffffffffffffffff;
            uStack_90 = (undefined1 *)0x0;
            pQStack_88 = (QAbstractItemModel *)0x0;
            iVar7 = (**(code **)(*(long *)this_00->proxy + 0x78))(this_00->proxy,&local_98);
            pQVar10 = this_00->proxy;
            iVar7 = iVar7 + -1;
            iVar5 = this_00->column;
            lVar9 = *(long *)pQVar10;
            goto LAB_0064c71a;
          }
          if ((int)local_58 != 0) goto LAB_0064c672;
          cVar4 = this_00->wrap;
joined_r0x0064c7f5:
          pQVar12 = (QObject *)0x1;
          if (cVar4 == '\x01') {
            pQVar12 = (QObject *)0x1;
            QCompleterPrivate::setCurrentIndex
                      (this_00,(QModelIndex)ZEXT824(0xffffffffffffffff),true);
          }
          goto LAB_0064c73e;
        }
        iVar5 = (int)local_58;
        iVar7 = local_58._4_4_;
        uVar13 = (undefined4)uStack_50;
        uVar14 = uStack_50._4_4_;
        tVar15.ptr = local_48.ptr;
LAB_0064c72a:
        index.c = iVar7;
        index.r = iVar5;
        index.i._0_4_ = uVar13;
        index.i._4_4_ = uVar14;
        index.m.ptr = tVar15.ptr;
        QCompleterPrivate::setCurrentIndex(this_00,index,true);
LAB_0064c73b:
        pQVar12 = (QObject *)0x1;
      }
      else {
LAB_0064c4ec:
        pDVar8 = (this_00->widget).wp.d;
        if (pDVar8 == (Data *)0x0) {
LAB_0064c583:
          pQVar12 = (QObject *)0x1;
          if (e[0xc] != (QEvent)0x0) goto LAB_0064c73e;
        }
        else {
          if ((*(int *)(pDVar8 + 4) != 0) &&
             (pQVar12 = (this_00->widget).wp.value, pQVar12 != (QObject *)0x0)) {
            this_00->eatFocusOut = false;
            (**(code **)(*(long *)pQVar12 + 0x28))(pQVar12,e);
            this_00->eatFocusOut = true;
            pDVar8 = (this_00->widget).wp.d;
            if (pDVar8 == (Data *)0x0) goto LAB_0064c583;
          }
          if (((*(int *)(pDVar8 + 4) == 0) || ((this_00->widget).wp.value == (QObject *)0x0)) ||
             ((e[0xc] != (QEvent)0x0 ||
              ((((this_00->popup->super_QAbstractScrollArea).super_QFrame.super_QWidget.data)->
                widget_attributes & 0x8000) == 0)))) {
            if (((*(int *)(pDVar8 + 4) != 0) &&
                (this_02 = (QWidget *)(this_00->widget).wp.value, this_02 != (QWidget *)0x0)) &&
               (bVar3 = QWidget::hasFocus(this_02), !bVar3)) {
              QWidget::hide((QWidget *)this_00->popup);
            }
            goto LAB_0064c583;
          }
        }
        cVar4 = QKeyEvent::matches((StandardKey)e);
        if (cVar4 != '\0') {
          QWidget::hide((QWidget *)this_00->popup);
          goto LAB_0064c73b;
        }
        pQVar12 = (QObject *)0x1;
        if (iVar5 < 0x1000004) {
          if (iVar5 == 0x1000001) goto LAB_0064c794;
          if (iVar5 == 0x1000002) goto LAB_0064c786;
        }
        else if (iVar5 + 0xfefffffcU < 2) {
LAB_0064c794:
          QWidget::hide((QWidget *)this_00->popup);
          if (((-1 < (int)local_58) && (-1 < (long)local_58)) &&
             (local_48.ptr != (QAbstractItemModel *)0x0)) {
            index_00.i._0_4_ = (int)uStack_50;
            index_00._0_8_ = local_58;
            index_00.i._4_4_ = (int)((ulong)uStack_50 >> 0x20);
            index_00.m.ptr = local_48.ptr;
            QCompleterPrivate::_q_complete(this_00,index_00,false);
          }
        }
        else if ((iVar5 == 0x1000033) && (uVar6 = QKeyEvent::modifiers(), (uVar6 >> 0x1b & 1) != 0))
        {
LAB_0064c786:
          QWidget::hide((QWidget *)this_00->popup);
        }
      }
LAB_0064c73e:
      if (local_78 != (QArrayData *)0x0) {
        LOCK();
        (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_78,0x18,0x10);
        }
      }
    }
  }
LAB_0064c3fa:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return SUB81(pQVar12,0);
  }
LAB_0064c831:
  __stack_chk_fail();
}

Assistant:

bool QCompleter::eventFilter(QObject *o, QEvent *e)
{
    Q_D(QCompleter);

    if (o == d->widget) {
        switch (e->type()) {
        case QEvent::FocusOut:
            if (d->eatFocusOut) {
                d->hiddenBecauseNoMatch = false;
                if (d->popup && d->popup->isVisible())
                    return true;
            }
            break;
        case QEvent::Hide:
            if (d->popup)
                d->popup->hide();
            break;
        default:
            break;
        }
    }

    if (o != d->popup)
        return QObject::eventFilter(o, e);

    Q_ASSERT(d->popup);
    switch (e->type()) {
    case QEvent::KeyPress: {
        QKeyEvent *ke = static_cast<QKeyEvent *>(e);

        QModelIndex curIndex = d->popup->currentIndex();
        QModelIndexList selList = d->popup->selectionModel()->selectedIndexes();

        const int key = ke->key();
        // In UnFilteredPopup mode, select the current item
        if ((key == Qt::Key_Up || key == Qt::Key_Down) && selList.isEmpty() && curIndex.isValid()
            && d->mode == QCompleter::UnfilteredPopupCompletion) {
              d->setCurrentIndex(curIndex);
              return true;
        }

        // Handle popup navigation keys. These are hardcoded because up/down might make the
        // widget do something else (lineedit cursor moves to home/end on mac, for instance)
        switch (key) {
        case Qt::Key_End:
        case Qt::Key_Home:
            if (ke->modifiers() & Qt::ControlModifier)
                return false;
            break;

        case Qt::Key_Up:
            if (!curIndex.isValid()) {
                int rowCount = d->proxy->rowCount();
                QModelIndex lastIndex = d->proxy->index(rowCount - 1, d->column);
                d->setCurrentIndex(lastIndex);
                return true;
            } else if (curIndex.row() == 0) {
                if (d->wrap)
                    d->setCurrentIndex(QModelIndex());
                return true;
            }
            return false;

        case Qt::Key_Down:
            if (!curIndex.isValid()) {
                QModelIndex firstIndex = d->proxy->index(0, d->column);
                d->setCurrentIndex(firstIndex);
                return true;
            } else if (curIndex.row() == d->proxy->rowCount() - 1) {
                if (d->wrap)
                    d->setCurrentIndex(QModelIndex());
                return true;
            }
            return false;

        case Qt::Key_PageUp:
        case Qt::Key_PageDown:
            return false;
        }

        if (d->widget) {
            // Send the event to the widget. If the widget accepted the event, do nothing
            // If the widget did not accept the event, provide a default implementation
            d->eatFocusOut = false;
            (static_cast<QObject *>(d->widget))->event(ke);
            d->eatFocusOut = true;
        }
        if (!d->widget || e->isAccepted() || !d->popup->isVisible()) {
            // widget lost focus, hide the popup
            if (d->widget && (!d->widget->hasFocus()
#ifdef QT_KEYPAD_NAVIGATION
                || (QApplicationPrivate::keypadNavigationEnabled() && !d->widget->hasEditFocus())
#endif
                ))
                d->popup->hide();
            if (e->isAccepted())
                return true;
        }

        // default implementation for keys not handled by the widget when popup is open
#if QT_CONFIG(shortcut)
        if (ke->matches(QKeySequence::Cancel)) {
            d->popup->hide();
            return true;
        }
#endif
        switch (key) {
#ifdef QT_KEYPAD_NAVIGATION
        case Qt::Key_Select:
            if (!QApplicationPrivate::keypadNavigationEnabled())
                break;
#endif
        case Qt::Key_Return:
        case Qt::Key_Enter:
        case Qt::Key_Tab:
            d->popup->hide();
            if (curIndex.isValid())
                d->_q_complete(curIndex);
            break;

        case Qt::Key_F4:
            if (ke->modifiers() & Qt::AltModifier)
                d->popup->hide();
            break;

        case Qt::Key_Backtab:
            d->popup->hide();
            break;

        default:
            break;
        }

        return true;
    }

#ifdef QT_KEYPAD_NAVIGATION
    case QEvent::KeyRelease: {
        if (d->widget &&
            QApplicationPrivate::keypadNavigationEnabled() && ke->key() == Qt::Key_Back) {
            QKeyEvent *ke = static_cast<QKeyEvent *>(e);
            // Send the event to the 'widget'. This is what we did for KeyPress, so we need
            // to do the same for KeyRelease, in case the widget's KeyPress event set
            // up something (such as a timer) that is relying on also receiving the
            // key release. I see this as a bug in Qt, and should really set it up for all
            // the affected keys. However, it is difficult to tell how this will affect
            // existing code, and I can't test for every combination!
            d->eatFocusOut = false;
            static_cast<QObject *>(d->widget)->event(ke);
            d->eatFocusOut = true;
        }
        break;
    }
#endif

    case QEvent::MouseButtonPress: {
#ifdef QT_KEYPAD_NAVIGATION
        if (d->widget
            && QApplicationPrivate::keypadNavigationEnabled()) {
            // if we've clicked in the widget (or its descendant), let it handle the click
            QWidget *source = qobject_cast<QWidget *>(o);
            if (source) {
                QPoint pos = source->mapToGlobal((static_cast<QMouseEvent *>(e))->pos());
                QWidget *target = QApplication::widgetAt(pos);
                if (target && (d->widget->isAncestorOf(target) ||
                    target == d->widget)) {
                    d->eatFocusOut = false;
                    static_cast<QObject *>(target)->event(e);
                    d->eatFocusOut = true;
                    return true;
                }
            }
        }
#endif
        if (!d->popup->underMouse()) {
            if (!QGuiApplicationPrivate::maybeForwardEventToVirtualKeyboard(e))
                d->popup->hide();
            return true;
        }
        }
        return false;

    case QEvent::MouseButtonRelease:
        QGuiApplicationPrivate::maybeForwardEventToVirtualKeyboard(e);
        return true;
    case QEvent::InputMethod:
    case QEvent::ShortcutOverride:
        if (d->widget)
            QCoreApplication::sendEvent(d->widget, e);
        break;

    default:
        return false;
    }
    return false;
}